

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O0

ShaderPair * __thiscall
deqp::gles3::Functional::anon_unknown_1::BasicInvarianceTest::genShaders
          (ShaderPair *__return_storage_ptr__,BasicInvarianceTest *this)

{
  BasicInvarianceTest *this_local;
  ShaderPair *retVal;
  
  InvarianceTest::ShaderPair::ShaderPair(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->m_vertexShader1)
  ;
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->vertexShaderSource1,(string *)&this->m_vertexShader2
            );
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragmentShaderSource0,
             (string *)&this->m_fragmentShader);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->fragmentShaderSource1,
             (string *)&this->m_fragmentShader);
  return __return_storage_ptr__;
}

Assistant:

BasicInvarianceTest::ShaderPair BasicInvarianceTest::genShaders (void) const
{
	ShaderPair retVal;

	retVal.vertexShaderSource0 = m_vertexShader1;
	retVal.vertexShaderSource1 = m_vertexShader2;
	retVal.fragmentShaderSource0 = m_fragmentShader;
	retVal.fragmentShaderSource1 = m_fragmentShader;

	return retVal;
}